

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O3

QString * __thiscall
SecurityDirWrapper::translateType(QString *__return_storage_ptr__,SecurityDirWrapper *this,int type)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  switch(type) {
  case 1:
    psVar1 = (storage_type *)0x11;
    break;
  case 2:
    psVar1 = (storage_type *)0x10;
    break;
  case 3:
    psVar1 = (storage_type *)0x8;
    break;
  default:
    psVar1 = (storage_type *)0x0;
    break;
  case 9:
    psVar1 = (storage_type *)0x18;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::translateType(int type)
{
    switch (type) {
        case pe::WIN_CERT_TYPE_X509  : return "X.509 certificate";
        case pe::WIN_CERT_TYPE_PKCS_SIGNED_DATA : return "PKCS Signed Data";
        case pe::WIN_CERT_TYPE_RESERVED_1 : return "Reserved";
        case pe::WIN_CERT_TYPE_PKCS1_SIGN : return "PKCS1 Module Sign Fields";
    }
    return "";
}